

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestVerifyUint32BigFieldNumber::_InternalSerialize
          (TestVerifyUint32BigFieldNumber *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestAllTypes *value;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint8_t *puVar7;
  RepeatedPtrField<edition_unittest::TestAllTypes> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  TestAllTypes *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestVerifyUint32BigFieldNumber *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestVerifyUint32BigFieldNumber *this_local;
  
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar6;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 2) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar3 = _internal_optional_uint32_1(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1,uVar3,puVar7);
  }
  if ((uVar1 & 4) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar3 = _internal_optional_uint32_2(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2,uVar3,puVar7);
  }
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.optional_all_types_;
    iVar4 = edition_unittest::TestAllTypes::GetCachedSize
                      ((this->field_0)._impl_.optional_all_types_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)value,iVar4,(uint8_t *)stream_local,stream);
  }
  local_30 = 0;
  uVar5 = _internal_repeated_all_types_size(this);
  for (; local_30 < uVar5; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_all_types(this);
    this_01 = google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes>::Get
                        (this_00,local_30);
    iVar4 = edition_unittest::TestAllTypes::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (10,(MessageLite *)this_01,iVar4,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar3 = _internal_optional_uint32_63(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x3f,uVar3,puVar7)
    ;
  }
  if ((uVar1 & 0x10) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar3 = _internal_optional_uint32_64(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x40,uVar3,puVar7)
    ;
  }
  if ((uVar1 & 0x40) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar3 = _internal_optional_uint32_65(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x41,uVar3,puVar7)
    ;
  }
  if ((uVar1 & 0x20) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar3 = _internal_optional_uint32_1000(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1000,uVar3,puVar7)
    ;
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestVerifyUint32BigFieldNumber::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestVerifyUint32BigFieldNumber& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestVerifyUint32BigFieldNumber)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // uint32 optional_uint32_1 = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1, this_._internal_optional_uint32_1(), target);
  }

  // uint32 optional_uint32_2 = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        2, this_._internal_optional_uint32_2(), target);
  }

  // .edition_unittest.TestAllTypes optional_all_types = 9;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.optional_all_types_, this_._impl_.optional_all_types_->GetCachedSize(), target,
        stream);
  }

  // repeated .edition_unittest.TestAllTypes repeated_all_types = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_all_types_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_all_types().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // uint32 optional_uint32_63 = 63;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        63, this_._internal_optional_uint32_63(), target);
  }

  // uint32 optional_uint32_64 = 64;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        64, this_._internal_optional_uint32_64(), target);
  }

  // uint32 optional_uint32_65 = 65;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        65, this_._internal_optional_uint32_65(), target);
  }

  // uint32 optional_uint32_1000 = 1000;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1000, this_._internal_optional_uint32_1000(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestVerifyUint32BigFieldNumber)
  return target;
}